

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O1

void __thiscall
TPZEulerAnalysis::UpdateSolAndRhs<double>
          (TPZEulerAnalysis *this,TPZFMatrix<double> *deltaSol,REAL *epsilon)

{
  TPZSolutionMatrix *this_00;
  TPZFMatrix<std::complex<double>_> *pTVar1;
  ESolType EVar2;
  TPZFMatrix<double> *pTVar3;
  TPZFMatrix<double> *pTVar4;
  TPZSolutionMatrix *residual;
  double __x;
  double extraout_XMM0_Qa;
  REAL RVar5;
  double dVar6;
  double extraout_XMM0_Qa_00;
  
  this_00 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution;
  pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
  dVar6 = *epsilon;
  TPZFMatrix<double>::operator+=(pTVar3,&deltaSol->super_TPZMatrix<double>);
  TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x22])(this)
  ;
  EVar2 = (this->super_TPZLinearAnalysis).fRhs.fSolType;
  if (EVar2 == EComplex) {
    pTVar1 = &(this->super_TPZLinearAnalysis).fRhs.fComplexMatrix;
    Dot<std::complex<double>>(pTVar1,pTVar1);
    __x = extraout_XMM0_Qa;
  }
  else {
    if (EVar2 != EReal) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                 ,0x98);
    }
    pTVar4 = &(this->super_TPZLinearAnalysis).fRhs.fRealMatrix;
    __x = Dot<double>(pTVar4,pTVar4);
  }
  if (__x < 0.0) {
    RVar5 = sqrt(__x);
  }
  else {
    RVar5 = SQRT(__x);
  }
  *epsilon = RVar5;
  if (dVar6 < *epsilon) {
    TPZFMatrix<double>::operator-=(pTVar3,&deltaSol->super_TPZMatrix<double>);
    residual = this_00;
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    pTVar4 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
    LineSearch(this,(REAL *)residual,pTVar4,deltaSol);
    TPZFMatrix<double>::operator+=(pTVar3,&deltaSol->super_TPZMatrix<double>);
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    EVar2 = (this->super_TPZLinearAnalysis).fRhs.fSolType;
    if (EVar2 == EComplex) {
      pTVar1 = &(this->super_TPZLinearAnalysis).fRhs.fComplexMatrix;
      Dot<std::complex<double>>(pTVar1,pTVar1);
      dVar6 = extraout_XMM0_Qa_00;
    }
    else {
      if (EVar2 != EReal) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"STATE Norm(const TPZSolutionMatrix &)",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Type is not set. Aborting...\n",0x1d);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.h"
                   ,0x98);
      }
      pTVar3 = &(this->super_TPZLinearAnalysis).fRhs.fRealMatrix;
      dVar6 = Dot<double>(pTVar3,pTVar3);
    }
    if (dVar6 < 0.0) {
      RVar5 = sqrt(dVar6);
    }
    else {
      RVar5 = SQRT(dVar6);
    }
    *epsilon = RVar5;
  }
  return;
}

Assistant:

void TPZEulerAnalysis::UpdateSolAndRhs(TPZFMatrix<TVar> & deltaSol, REAL & epsilon)
{
	TPZFMatrix<TVar> &sol = fSolution;
    REAL initEpsilon = epsilon;
    int outofrange = 0;
    try
    {
        sol += deltaSol;
        fCompMesh->LoadSolution(fSolution);
        AssembleRhs();
        epsilon = Norm(fRhs);
    }
	catch(...)
	{
		outofrange = 1;
		sol -= deltaSol;
		epsilon = initEpsilon;
		fCompMesh->LoadSolution(fSolution);
	}
	
    if(epsilon > initEpsilon)
    {
		sol -= deltaSol;
		fCompMesh->LoadSolution(fSolution);
		/*int resultlin = */
		LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
    }
	
    if(outofrange)
    {
		/*int resultlin = */LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
		fFlowCompMesh->ScaleCFL(.5);
    }
}